

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void freedelem(rnndelem *elem)

{
  long lVar1;
  
  cleanupvarinfo(&elem->varinfo);
  cleanuptypeinfo(&elem->typeinfo);
  for (lVar1 = 0; lVar1 < elem->subelemsnum; lVar1 = lVar1 + 1) {
    freedelem(elem->subelems[lVar1]);
  }
  free(elem->subelems);
  free(elem->fullname);
  free(elem->name);
  free(elem);
  return;
}

Assistant:

static void freedelem(struct rnndelem *elem) {
	int i;
	cleanupvarinfo (&elem->varinfo);
	cleanuptypeinfo(&elem->typeinfo);
	for (i = 0; i < elem->subelemsnum; i++)
		freedelem(elem->subelems[i]);
	free(elem->subelems);

	free(elem->fullname);
	free(elem->name);
	free(elem);
}